

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Array<unsigned_char> *
kj::_::CopyConstructArray_<kj::Array<unsigned_char>,_kj::Array<unsigned_char>_*,_true,_false>::apply
          (Array<unsigned_char> *pos,Array<unsigned_char> *start,Array<unsigned_char> *end)

{
  Array<unsigned_char> *params;
  Array<unsigned_char> *end_local;
  Array<unsigned_char> *start_local;
  Array<unsigned_char> *pos_local;
  
  end_local = start;
  start_local = pos;
  while (end_local != end) {
    params = mv<kj::Array<unsigned_char>>(end_local);
    ctor<kj::Array<unsigned_char>,kj::Array<unsigned_char>>(start_local,params);
    end_local = end_local + 1;
    start_local = start_local + 1;
  }
  return start_local;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }